

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::SliderBehaviorT<float,float,float>
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,float *v,float v_min,float v_max,
               char *format,ImGuiSliderFlags flags,ImRect *out_grab_bb)

{
  ImVec2 IVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined8 uVar4;
  undefined8 uVar5;
  byte bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ImGuiContext *pIVar9;
  int iVar10;
  ImGuiContext *g;
  bool bVar11;
  uint uVar12;
  uint uVar13;
  bool bVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar19;
  float fVar20;
  float fVar21;
  undefined1 in_register_00001204 [60];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 in_register_00001244 [60];
  undefined1 auVar24 [64];
  float fVar25;
  float zero_deadzone_halfsize;
  float fVar26;
  undefined1 extraout_var [56];
  
  pIVar9 = GImGui;
  auVar24._4_60_ = in_register_00001244;
  auVar24._0_4_ = v_max;
  auVar22._4_60_ = in_register_00001204;
  auVar22._0_4_ = v_min;
  uVar12 = data_type & 0xfffffffe;
  uVar13 = flags & 0x100000;
  uVar5 = vcmpss_avx512f(auVar22._0_16_,auVar24._0_16_,1);
  bVar11 = (bool)((byte)uVar5 & 1);
  auVar17 = ZEXT816(0) << 0x40;
  fVar20 = *(float *)((long)&(bb->Max).x + (ulong)(uVar13 >> 0x12));
  fVar26 = *(float *)((long)&(bb->Min).x + (ulong)(uVar13 >> 0x12));
  fVar16 = (GImGui->Style).GrabMinSize;
  fVar2 = (fVar20 - fVar26) + -4.0;
  fVar15 = (float)((uint)bVar11 * (int)(v_max - v_min) + (uint)!bVar11 * (int)(v_min - v_max));
  uVar5 = vcmpps_avx512vl(auVar17,ZEXT416((uint)fVar15),2);
  fVar25 = fVar2 / (fVar15 + 1.0);
  uVar4 = vcmpps_avx512vl(ZEXT416((uint)fVar16),ZEXT416((uint)fVar25),2);
  bVar6 = (byte)uVar5 & (byte)uVar4;
  auVar3 = vminss_avx(ZEXT416((uint)(bVar6 & 1) *
                              ((uint)(uVar12 != 8) * (int)fVar25 + (uint)(uVar12 == 8) * (int)fVar16
                              ) + (uint)!(bool)(bVar6 & 1) * (int)fVar16),ZEXT416((uint)fVar2));
  fVar25 = 0.0;
  fVar16 = fVar2 - auVar3._0_4_;
  if ((flags & 0x20U) != 0) {
    if (uVar12 == 8) {
      iVar10 = ImParseFormatPrecision(format,3);
      fVar25 = (float)iVar10;
    }
    else {
      fVar25 = 1.0;
    }
    fVar25 = powf(0.1,fVar25);
    auVar17 = vmaxss_avx(ZEXT416((uint)fVar16),ZEXT416(0x3f800000));
    auVar17 = ZEXT416((uint)(((pIVar9->Style).LogSliderDeadzone * 0.5) / auVar17._0_4_));
  }
  zero_deadzone_halfsize = auVar17._0_4_;
  auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar26 + 2.0)),auVar3,SUB6416(ZEXT464(0x3f000000),0));
  fVar26 = auVar17._0_4_;
  if (pIVar9->ActiveId == id) {
    if (pIVar9->ActiveIdSource == ImGuiInputSource_Nav) {
      if (pIVar9->ActiveIdIsJustActivated == true) {
        pIVar9->SliderCurrentAccum = 0.0;
        pIVar9->SliderCurrentAccumDirty = false;
      }
      auVar23._0_8_ = GetNavInputAmount2d(6,ImGuiInputReadMode_RepeatFast,0.0,0.0);
      auVar23._8_56_ = extraout_var;
      auVar17 = vmovshdup_avx(auVar23._0_16_);
      auVar18._8_4_ = 0x80000000;
      auVar18._0_8_ = 0x8000000080000000;
      auVar18._12_4_ = 0x80000000;
      auVar17 = vxorps_avx512vl(auVar17,auVar18);
      auVar17._0_4_ =
           (float)((uint)(uVar13 == 0) * (int)auVar23._0_4_ + (uint)(uVar13 != 0) * auVar17._0_4_);
      if ((auVar17._0_4_ != 0.0) || (NAN(auVar17._0_4_))) {
        if ((uVar12 == 8) && (iVar10 = ImParseFormatPrecision(format,3), 0 < iVar10)) {
          uVar5 = vcmpss_avx512f(ZEXT816(0) << 0x40,ZEXT416((uint)(GImGui->IO).NavInputs[0xe]),1);
          bVar11 = (bool)((byte)uVar5 & 1);
          fVar15 = (float)((uint)bVar11 * (int)((auVar17._0_4_ / 100.0) / 10.0) +
                          (uint)!bVar11 * (int)(auVar17._0_4_ / 100.0));
        }
        else {
          auVar8._8_4_ = 0x7fffffff;
          auVar8._0_8_ = 0x7fffffff7fffffff;
          auVar8._12_4_ = 0x7fffffff;
          auVar18 = vandps_avx512vl(ZEXT416((uint)fVar15),auVar8);
          if ((auVar18._0_4_ <= 100.0) || (0.0 < (GImGui->IO).NavInputs[0xe])) {
            uVar5 = vcmpss_avx512f(auVar17,ZEXT816(0) << 0x40,1);
            bVar11 = (bool)((byte)uVar5 & 1);
            fVar15 = (float)((uint)bVar11 * -0x40800000 + (uint)!bVar11 * 0x3f800000) / fVar15;
          }
          else {
            fVar15 = auVar17._0_4_ / 100.0;
          }
        }
        uVar5 = vcmpss_avx512f(ZEXT816(0) << 0x40,ZEXT416((uint)(GImGui->IO).NavInputs[0xf]),1);
        bVar11 = (bool)((byte)uVar5 & 1);
        fVar15 = (float)((uint)bVar11 * (int)(fVar15 * 10.0) + (uint)!bVar11 * (int)fVar15) +
                 pIVar9->SliderCurrentAccum;
        pIVar9->SliderCurrentAccum = fVar15;
        pIVar9->SliderCurrentAccumDirty = true;
      }
      else {
        fVar15 = pIVar9->SliderCurrentAccum;
      }
      if ((pIVar9->NavActivatePressedId == id) && (pIVar9->ActiveIdIsJustActivated == false)) {
        ClearActiveID();
      }
      else if (pIVar9->SliderCurrentAccumDirty == true) {
        bVar11 = SUB41((flags & 0x20U) >> 5,0);
        fVar19 = ScaleRatioFromValueT<float,float,float>
                           (data_type,*v,v_min,v_max,bVar11,fVar25,zero_deadzone_halfsize);
        if (((fVar19 < 1.0) || (fVar15 <= 0.0)) && ((0.0 < fVar19 || (0.0 <= fVar15)))) {
          uVar5 = vcmpss_avx512f(ZEXT416((uint)(fVar15 + fVar19)),ZEXT816(0) << 0x40,1);
          auVar17 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar15 + fVar19)));
          fVar16 = (float)((uint)!(bool)((byte)uVar5 & 1) * auVar17._0_4_);
          fVar21 = ScaleValueFromRatioT<float,float,float>
                             (data_type,fVar16,v_min,v_max,bVar11,fVar25,zero_deadzone_halfsize);
          if ((flags & 0x40U) == 0) {
            fVar21 = RoundScalarWithFormatT<float,float>(format,data_type,fVar21);
          }
          fVar21 = ScaleRatioFromValueT<float,float,float>
                             (data_type,fVar21,v_min,v_max,bVar11,fVar25,zero_deadzone_halfsize);
          fVar21 = fVar21 - fVar19;
          bVar11 = fVar15 <= fVar21;
          if (0.0 < fVar15) {
            bVar11 = fVar21 < fVar15;
          }
          pIVar9->SliderCurrentAccum =
               pIVar9->SliderCurrentAccum -
               (float)((uint)bVar11 * (int)fVar21 + (uint)!bVar11 * (int)fVar15);
          pIVar9->SliderCurrentAccumDirty = false;
          goto LAB_002ff05e;
        }
        pIVar9->SliderCurrentAccum = 0.0;
        pIVar9->SliderCurrentAccumDirty = false;
      }
    }
    else if (pIVar9->ActiveIdSource == ImGuiInputSource_Mouse) {
      if ((pIVar9->IO).MouseDown[0] == false) {
        ClearActiveID();
      }
      else {
        fVar15 = 0.0;
        if (0.0 < fVar16) {
          auVar18 = ZEXT416((uint)((*(float *)((pIVar9->IO).MouseDown +
                                              (ulong)(uVar13 >> 0x14) * 4 + -8) - fVar26) / fVar16))
          ;
          auVar17 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar18);
          uVar5 = vcmpss_avx512f(auVar18,ZEXT816(0),1);
          fVar15 = (float)((uint)!(bool)((byte)uVar5 & 1) * auVar17._0_4_);
        }
        fVar16 = (float)((uint)(uVar13 == 0) * (int)fVar15 +
                        (uint)(uVar13 != 0) * (int)(1.0 - fVar15));
LAB_002ff05e:
        fVar16 = ScaleValueFromRatioT<float,float,float>
                           (data_type,fVar16,v_min,v_max,SUB41((flags & 0x20U) >> 5,0),fVar25,
                            zero_deadzone_halfsize);
        if ((flags & 0x40U) == 0) {
          fVar16 = RoundScalarWithFormatT<float,float>(format,data_type,fVar16);
        }
        if ((*v != fVar16) || (NAN(*v) || NAN(fVar16))) {
          bVar11 = true;
          *v = fVar16;
          goto LAB_002ff416;
        }
      }
      bVar11 = false;
      goto LAB_002ff416;
    }
  }
  bVar11 = false;
LAB_002ff416:
  if (1.0 <= fVar2) {
    auVar7._8_4_ = 0x80000000;
    auVar7._0_8_ = 0x8000000080000000;
    auVar7._12_4_ = 0x80000000;
    auVar18 = vxorps_avx512vl(auVar3,auVar7);
    auVar17 = vfnmadd231ss_fma(ZEXT416((uint)(fVar20 + -2.0)),auVar3,SUB6416(ZEXT464(0x3f000000),0))
    ;
    fVar20 = ScaleRatioFromValueT<float,float,float>
                       (data_type,*v,v_min,v_max,SUB41((flags & 0x20U) >> 5,0),fVar25,
                        zero_deadzone_halfsize);
    bVar14 = uVar13 == 0;
    auVar17 = vfmadd213ss_fma(ZEXT416((uint)(auVar17._0_4_ - fVar26)),
                              ZEXT416((uint)bVar14 * (int)fVar20 +
                                      (uint)!bVar14 * (int)(1.0 - fVar20)),ZEXT416((uint)fVar26));
    if (bVar14) {
      fVar20 = (bb->Min).y;
      fVar26 = (bb->Max).y;
      auVar18 = vfmadd213ss_fma(auVar18,SUB6416(ZEXT464(0x3f000000),0),auVar17);
      auVar3 = vfmadd213ss_fma(auVar3,SUB6416(ZEXT464(0x3f000000),0),auVar17);
      (out_grab_bb->Min).x = auVar18._0_4_;
      (out_grab_bb->Min).y = fVar20 + 2.0;
      (out_grab_bb->Max).x = auVar3._0_4_;
      (out_grab_bb->Max).y = fVar26 + -2.0;
    }
    else {
      fVar20 = (bb->Max).x;
      auVar18 = vfmadd213ss_fma(auVar18,SUB6416(ZEXT464(0x3f000000),0),auVar17);
      auVar3 = vfmadd213ss_fma(auVar3,SUB6416(ZEXT464(0x3f000000),0),auVar17);
      (out_grab_bb->Min).x = (bb->Min).x + 2.0;
      (out_grab_bb->Min).y = auVar18._0_4_;
      (out_grab_bb->Max).x = fVar20 + -2.0;
      (out_grab_bb->Max).y = auVar3._0_4_;
    }
  }
  else {
    IVar1 = bb->Min;
    out_grab_bb->Min = IVar1;
    out_grab_bb->Max = IVar1;
  }
  return bVar11;
}

Assistant:

bool ImGui::SliderBehaviorT(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, TYPE* v, const TYPE v_min, const TYPE v_max, const char* format, ImGuiSliderFlags flags, ImRect* out_grab_bb)
{
    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_logarithmic = (flags & ImGuiSliderFlags_Logarithmic) != 0;
    const bool is_floating_point = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);

    const float grab_padding = 2.0f;
    const float slider_sz = (bb.Max[axis] - bb.Min[axis]) - grab_padding * 2.0f;
    float grab_sz = style.GrabMinSize;
    SIGNEDTYPE v_range = (v_min < v_max ? v_max - v_min : v_min - v_max);
    if (!is_floating_point && v_range >= 0)                                             // v_range < 0 may happen on integer overflows
        grab_sz = ImMax((float)(slider_sz / (v_range + 1)), style.GrabMinSize);  // For integer sliders: if possible have the grab size represent 1 unit
    grab_sz = ImMin(grab_sz, slider_sz);
    const float slider_usable_sz = slider_sz - grab_sz;
    const float slider_usable_pos_min = bb.Min[axis] + grab_padding + grab_sz * 0.5f;
    const float slider_usable_pos_max = bb.Max[axis] - grab_padding - grab_sz * 0.5f;

    float logarithmic_zero_epsilon = 0.0f; // Only valid when is_logarithmic is true
    float zero_deadzone_halfsize = 0.0f; // Only valid when is_logarithmic is true
    if (is_logarithmic)
    {
        // When using logarithmic sliders, we need to clamp to avoid hitting zero, but our choice of clamp value greatly affects slider precision. We attempt to use the specified precision to estimate a good lower bound.
        const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 1;
        logarithmic_zero_epsilon = ImPow(0.1f, (float)decimal_precision);
        zero_deadzone_halfsize = (style.LogSliderDeadzone * 0.5f) / ImMax(slider_usable_sz, 1.0f);
    }

    // Process interacting with the slider
    bool value_changed = false;
    if (g.ActiveId == id)
    {
        bool set_new_value = false;
        float clicked_t = 0.0f;
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (!g.IO.MouseDown[0])
            {
                ClearActiveID();
            }
            else
            {
                const float mouse_abs_pos = g.IO.MousePos[axis];
                clicked_t = (slider_usable_sz > 0.0f) ? ImClamp((mouse_abs_pos - slider_usable_pos_min) / slider_usable_sz, 0.0f, 1.0f) : 0.0f;
                if (axis == ImGuiAxis_Y)
                    clicked_t = 1.0f - clicked_t;
                set_new_value = true;
            }
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            if (g.ActiveIdIsJustActivated)
            {
                g.SliderCurrentAccum = 0.0f; // Reset any stored nav delta upon activation
                g.SliderCurrentAccumDirty = false;
            }

            const ImVec2 input_delta2 = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 0.0f, 0.0f);
            float input_delta = (axis == ImGuiAxis_X) ? input_delta2.x : -input_delta2.y;
            if (input_delta != 0.0f)
            {
                const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 0;
                if (decimal_precision > 0)
                {
                    input_delta /= 100.0f;    // Gamepad/keyboard tweak speeds in % of slider bounds
                    if (IsNavInputDown(ImGuiNavInput_TweakSlow))
                        input_delta /= 10.0f;
                }
                else
                {
                    if ((v_range >= -100.0f && v_range <= 100.0f) || IsNavInputDown(ImGuiNavInput_TweakSlow))
                        input_delta = ((input_delta < 0.0f) ? -1.0f : +1.0f) / (float)v_range; // Gamepad/keyboard tweak speeds in integer steps
                    else
                        input_delta /= 100.0f;
                }
                if (IsNavInputDown(ImGuiNavInput_TweakFast))
                    input_delta *= 10.0f;

                g.SliderCurrentAccum += input_delta;
                g.SliderCurrentAccumDirty = true;
            }

            float delta = g.SliderCurrentAccum;
            if (g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            {
                ClearActiveID();
            }
            else if (g.SliderCurrentAccumDirty)
            {
                clicked_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

                if ((clicked_t >= 1.0f && delta > 0.0f) || (clicked_t <= 0.0f && delta < 0.0f)) // This is to avoid applying the saturation when already past the limits
                {
                    set_new_value = false;
                    g.SliderCurrentAccum = 0.0f; // If pushing up against the limits, don't continue to accumulate
                }
                else
                {
                    set_new_value = true;
                    float old_clicked_t = clicked_t;
                    clicked_t = ImSaturate(clicked_t + delta);

                    // Calculate what our "new" clicked_t will be, and thus how far we actually moved the slider, and subtract this from the accumulator
                    TYPE v_new = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, clicked_t, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
                    if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
                        v_new = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_new);
                    float new_clicked_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_new, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

                    if (delta > 0)
                        g.SliderCurrentAccum -= ImMin(new_clicked_t - old_clicked_t, delta);
                    else
                        g.SliderCurrentAccum -= ImMax(new_clicked_t - old_clicked_t, delta);
                }

                g.SliderCurrentAccumDirty = false;
            }
        }

        if (set_new_value)
        {
            TYPE v_new = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, clicked_t, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

            // Round to user desired precision based on format string
            if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
                v_new = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_new);

            // Apply result
            if (*v != v_new)
            {
                *v = v_new;
                value_changed = true;
            }
        }
    }

    if (slider_sz < 1.0f)
    {
        *out_grab_bb = ImRect(bb.Min, bb.Min);
    }
    else
    {
        // Output grab position so it can be displayed by the caller
        float grab_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        if (axis == ImGuiAxis_Y)
            grab_t = 1.0f - grab_t;
        const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
        if (axis == ImGuiAxis_X)
            *out_grab_bb = ImRect(grab_pos - grab_sz * 0.5f, bb.Min.y + grab_padding, grab_pos + grab_sz * 0.5f, bb.Max.y - grab_padding);
        else
            *out_grab_bb = ImRect(bb.Min.x + grab_padding, grab_pos - grab_sz * 0.5f, bb.Max.x - grab_padding, grab_pos + grab_sz * 0.5f);
    }

    return value_changed;
}